

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprVariableDefinition *
CreateFunctionContextArgument(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  uint uniqueId;
  TypeBase *pTVar1;
  uint offset;
  int iVar2;
  undefined4 extraout_var;
  VariableData *pVVar3;
  ExprVariableDefinition *pEVar4;
  VariableHandle *pVVar5;
  char *pcVar6;
  bool bVar7;
  SynIdentifier *name;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pTVar1 = function->contextType;
  if (pTVar1->isGeneric != true) {
    offset = anon_unknown.dwarf_c6b42::AllocateArgumentInScope(ctx,source,0,pTVar1);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
    bVar7 = function->scope->ownerType == (TypeBase *)0x0;
    pcVar6 = "this";
    if (bVar7) {
      pcVar6 = "$context";
    }
    (name->super_SynBase).typeID = 4;
    (name->super_SynBase).begin = (Lexeme *)0x0;
    (name->super_SynBase).end = (Lexeme *)0x0;
    (name->super_SynBase).pos.begin = (char *)0x0;
    (name->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
    (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
    (name->name).begin = pcVar6;
    (name->name).end = pcVar6 + (ulong)bVar7 * 4 + 4;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    pVVar3 = (VariableData *)CONCAT44(extraout_var_00,iVar2);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              (pVVar3,ctx->allocator,source,ctx->scope,0,pTVar1,name,offset,uniqueId);
    function->contextArgument = pVVar3;
    ExpressionContext::AddVariable(ctx,pVVar3,true);
    if (0xffff < function->functionScope->dataSize) {
      anon_unknown.dwarf_c6b42::Report
                (ctx,source,"ERROR: function argument size cannot exceed 65536");
    }
    if (0xffff < function->type->returnType->size) {
      anon_unknown.dwarf_c6b42::Report(ctx,source,"ERROR: function return size cannot exceed 65536")
      ;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar4 = (ExprVariableDefinition *)CONCAT44(extraout_var_01,iVar2);
    pTVar1 = ctx->typeVoid;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pVVar5 = (VariableHandle *)CONCAT44(extraout_var_02,iVar2);
    pVVar3 = function->contextArgument;
    pVVar5->source = (SynBase *)0x0;
    pVVar5->variable = pVVar3;
    pVVar5->next = (VariableHandle *)0x0;
    pVVar5->listed = false;
    (pEVar4->super_ExprBase).typeID = 0x1e;
    (pEVar4->super_ExprBase).source = source;
    (pEVar4->super_ExprBase).type = pTVar1;
    (pEVar4->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar4->super_ExprBase).listed = false;
    (pEVar4->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
    pEVar4->variable = pVVar5;
    pEVar4->initializer = (ExprBase *)0x0;
    return pEVar4;
  }
  __assert_fail("!type->isGeneric",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x21c9,
                "ExprVariableDefinition *CreateFunctionContextArgument(ExpressionContext &, SynBase *, FunctionData *)"
               );
}

Assistant:

ExprVariableDefinition* CreateFunctionContextArgument(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	TypeBase *type = function->contextType;

	assert(!type->isGeneric);

	unsigned offset = AllocateArgumentInScope(ctx, source, 0, type);

	SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr(function->scope->ownerType ? "this" : "$context"));

	function->contextArgument = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, nameIdentifier, offset, ctx.uniqueVariableId++);

	ctx.AddVariable(function->contextArgument, true);

	if(function->functionScope->dataSize >= 65536)
		Report(ctx, source, "ERROR: function argument size cannot exceed 65536");

	if(function->type->returnType->size >= 65536)
		Report(ctx, source, "ERROR: function return size cannot exceed 65536");

	return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, function->contextArgument), NULL);
}